

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangen.c
# Opt level: O0

void print_usage(char *prg)

{
  undefined8 in_RDI;
  
  fprintf(_stderr,"%s - CAN frames generator.\n\n",in_RDI);
  fprintf(_stderr,"Usage: %s [options] <CAN interface>\n",in_RDI);
  fprintf(_stderr,"Options:\n");
  fprintf(_stderr,"         -g <ms>       (gap in milli seconds - default: %d ms)\n",200);
  fprintf(_stderr,"         -a            (use absolute time for gap)\n");
  fprintf(_stderr,"         -t            (use SO_TXTIME)\n");
  fprintf(_stderr,"         --start <ns>  (start time (UTC nanoseconds))\n");
  fprintf(_stderr,"         --mark <id>   (set SO_MARK to <id>, default %u)\n",1);
  fprintf(_stderr,"         -e            (generate extended frame mode (EFF) CAN frames)\n");
  fprintf(_stderr,"         -f            (generate CAN FD CAN frames)\n");
  fprintf(_stderr,"         -b            (generate CAN FD CAN frames with bitrate switch (BRS))\n")
  ;
  fprintf(_stderr,"         -E            (generate CAN FD CAN frames with error state (ESI))\n");
  fprintf(_stderr,"         -X            (generate CAN XL CAN frames)\n");
  fprintf(_stderr,"         -R            (generate RTR frames)\n");
  fprintf(_stderr,
          "         -8            (allow DLC values greater then 8 for Classic CAN frames)\n");
  fprintf(_stderr,"         -m            (mix -e -f -b -E -R -X frames)\n");
  fprintf(_stderr,"         -I <mode>     (CAN ID generation mode - see below)\n");
  fprintf(_stderr,
          "         -L <mode>     (CAN data length code (dlc) generation mode - see below)\n");
  fprintf(_stderr,"         -D <mode>     (CAN data (payload) generation mode - see below)\n");
  fprintf(_stderr,"         -F <mode>     (CAN XL Flags generation mode - see below, no e/o mode)\n"
         );
  fprintf(_stderr,"         -S <mode>     (CAN XL SDT generation mode - see below, no e/o mode)\n");
  fprintf(_stderr,"         -A <mode>     (CAN XL AF generation mode - see below, no e/o mode)\n");
  fprintf(_stderr,"         -V <mode>     (CAN XL VCID generation mode - see below, no e/o mode)\n")
  ;
  fprintf(_stderr,"         -p <timeout>  (poll on -ENOBUFS to write frames with <timeout> ms)\n");
  fprintf(_stderr,"         -P <priority> (set socket priority using SO_PRIORITY)\n");
  fprintf(_stderr,"         -n <count>    (terminate after <count> CAN frames - default infinite)\n"
         );
  fprintf(_stderr,"         -i            (ignore -ENOBUFS return values on write() syscalls)\n");
  fprintf(_stderr,"         -x            (disable local loopback of generated CAN frames)\n");
  fprintf(_stderr,"         -c <count>    (number of messages to send in burst, default %u)\n",1);
  fprintf(_stderr,
          "         -v            (increment verbose level for printing sent CAN frames)\n\n");
  fprintf(_stderr,"Generation modes:\n");
  fprintf(_stderr," \'r\'     => random values (default)\n");
  fprintf(_stderr," \'e\'     => random values, even ID\n");
  fprintf(_stderr," \'o\'     => random values, odd ID\n");
  fprintf(_stderr," \'i\'     => increment values\n");
  fprintf(_stderr," <value> => fixed value (in hexadecimal for -I and -D)\n");
  fprintf(_stderr,"         => nibbles written as \'%c\' are randomized (only -D)\n\n",0x78);
  fprintf(_stderr,"The gap value (in milliseconds) may have decimal places, e.g. \'-g 4.73\'\n");
  fprintf(_stderr,"When incrementing the CAN data the data length code minimum is set to 1.\n");
  fprintf(_stderr,"CAN IDs and data content are given and expected in hexadecimal values.\n\n");
  fprintf(_stderr,"Examples:\n");
  fprintf(_stderr,"%s vcan0 -g 4 -I 42A -L 1 -D i -v -v\n",in_RDI);
  fprintf(_stderr,"\t(fixed CAN ID and length, inc. data)\n");
  fprintf(_stderr,"%s vcan0 -e -L i -v -v -v\n",in_RDI);
  fprintf(_stderr,"\t(generate EFF frames, incr. length)\n");
  fprintf(_stderr,"%s vcan0 -D 11223344DEADBEEF -L 8\n",in_RDI);
  fprintf(_stderr,"\t(fixed CAN data payload and length)\n");
  fprintf(_stderr,"%s vcan0 -D 11%c%c3344DEADBEEF -L 8\n",in_RDI,0x78);
  fprintf(_stderr,"\t(fixed CAN data payload where 2. byte is randomized, fixed length)\n");
  fprintf(_stderr,"%s vcan0 -I 555 -D CCCCCCCCCCCCCCCC -L 8 -g 3.75\n",in_RDI);
  fprintf(_stderr,"\t(generate a fix busload without bit-stuffing effects)\n");
  fprintf(_stderr,"%s vcan0 -g 0 -i -x\n",in_RDI);
  fprintf(_stderr,"\t(full load test ignoring -ENOBUFS)\n");
  fprintf(_stderr,"%s vcan0 -g 0 -p 10 -x\n",in_RDI);
  fprintf(_stderr,"\t(full load test with polling, 10ms timeout)\n");
  fprintf(_stderr,"%s vcan0\n",in_RDI);
  fprintf(_stderr,"\t(my favourite default :)\n\n");
  return;
}

Assistant:

static void print_usage(char *prg)
{
	fprintf(stderr, "%s - CAN frames generator.\n\n", prg);
	fprintf(stderr, "Usage: %s [options] <CAN interface>\n", prg);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "         -g <ms>       (gap in milli seconds - default: %d ms)\n", DEFAULT_GAP);
	fprintf(stderr, "         -a            (use absolute time for gap)\n");
	fprintf(stderr, "         -t            (use SO_TXTIME)\n");
	fprintf(stderr, "         --start <ns>  (start time (UTC nanoseconds))\n");
	fprintf(stderr, "         --mark <id>   (set SO_MARK to <id>, default %u)\n", DEFAULT_SO_MARK_VAL);
	fprintf(stderr, "         -e            (generate extended frame mode (EFF) CAN frames)\n");
	fprintf(stderr, "         -f            (generate CAN FD CAN frames)\n");
	fprintf(stderr, "         -b            (generate CAN FD CAN frames with bitrate switch (BRS))\n");
	fprintf(stderr, "         -E            (generate CAN FD CAN frames with error state (ESI))\n");
	fprintf(stderr, "         -X            (generate CAN XL CAN frames)\n");
	fprintf(stderr, "         -R            (generate RTR frames)\n");
	fprintf(stderr, "         -8            (allow DLC values greater then 8 for Classic CAN frames)\n");
	fprintf(stderr, "         -m            (mix -e -f -b -E -R -X frames)\n");
	fprintf(stderr, "         -I <mode>     (CAN ID generation mode - see below)\n");
	fprintf(stderr, "         -L <mode>     (CAN data length code (dlc) generation mode - see below)\n");
	fprintf(stderr, "         -D <mode>     (CAN data (payload) generation mode - see below)\n");
	fprintf(stderr, "         -F <mode>     (CAN XL Flags generation mode - see below, no e/o mode)\n");
	fprintf(stderr, "         -S <mode>     (CAN XL SDT generation mode - see below, no e/o mode)\n");
	fprintf(stderr, "         -A <mode>     (CAN XL AF generation mode - see below, no e/o mode)\n");
	fprintf(stderr, "         -V <mode>     (CAN XL VCID generation mode - see below, no e/o mode)\n");
	fprintf(stderr, "         -p <timeout>  (poll on -ENOBUFS to write frames with <timeout> ms)\n");
	fprintf(stderr, "         -P <priority> (set socket priority using SO_PRIORITY)\n");
	fprintf(stderr, "         -n <count>    (terminate after <count> CAN frames - default infinite)\n");
	fprintf(stderr, "         -i            (ignore -ENOBUFS return values on write() syscalls)\n");
	fprintf(stderr, "         -x            (disable local loopback of generated CAN frames)\n");
	fprintf(stderr, "         -c <count>    (number of messages to send in burst, default %u)\n", DEFAULT_BURST_COUNT);
	fprintf(stderr, "         -v            (increment verbose level for printing sent CAN frames)\n\n");
	fprintf(stderr, "Generation modes:\n");
	fprintf(stderr, " 'r'     => random values (default)\n");
	fprintf(stderr, " 'e'     => random values, even ID\n");
	fprintf(stderr, " 'o'     => random values, odd ID\n");
	fprintf(stderr, " 'i'     => increment values\n");
	fprintf(stderr, " <value> => fixed value (in hexadecimal for -I and -D)\n");
	fprintf(stderr, "         => nibbles written as '%c' are randomized (only -D)\n\n", CHAR_RANDOM);
	fprintf(stderr, "The gap value (in milliseconds) may have decimal places, e.g. '-g 4.73'\n");
	fprintf(stderr, "When incrementing the CAN data the data length code minimum is set to 1.\n");
	fprintf(stderr, "CAN IDs and data content are given and expected in hexadecimal values.\n\n");
	fprintf(stderr, "Examples:\n");
	fprintf(stderr, "%s vcan0 -g 4 -I 42A -L 1 -D i -v -v\n", prg);
	fprintf(stderr, "\t(fixed CAN ID and length, inc. data)\n");
	fprintf(stderr, "%s vcan0 -e -L i -v -v -v\n", prg);
	fprintf(stderr, "\t(generate EFF frames, incr. length)\n");
	fprintf(stderr, "%s vcan0 -D 11223344DEADBEEF -L 8\n", prg);
	fprintf(stderr, "\t(fixed CAN data payload and length)\n");
	fprintf(stderr, "%s vcan0 -D 11%c%c3344DEADBEEF -L 8\n", prg, CHAR_RANDOM, CHAR_RANDOM);
	fprintf(stderr, "\t(fixed CAN data payload where 2. byte is randomized, fixed length)\n");
	fprintf(stderr, "%s vcan0 -I 555 -D CCCCCCCCCCCCCCCC -L 8 -g 3.75\n", prg);
	fprintf(stderr, "\t(generate a fix busload without bit-stuffing effects)\n");
	fprintf(stderr, "%s vcan0 -g 0 -i -x\n", prg);
	fprintf(stderr, "\t(full load test ignoring -ENOBUFS)\n");
	fprintf(stderr, "%s vcan0 -g 0 -p 10 -x\n", prg);
	fprintf(stderr, "\t(full load test with polling, 10ms timeout)\n");
	fprintf(stderr, "%s vcan0\n", prg);
	fprintf(stderr, "\t(my favourite default :)\n\n");
}